

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_grammar.cpp
# Opt level: O0

void Omega_h::add_end_terminal(Grammar *g)

{
  bool bVar1;
  reference pPVar2;
  allocator local_89;
  string local_88 [32];
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  const_iterator local_58;
  int *local_50;
  int *rhs_symb;
  iterator __end2;
  iterator __begin2;
  RHS *__range2;
  Production *prod;
  iterator __end1;
  iterator __begin1;
  Productions *__range1;
  Grammar *g_local;
  
  __end1 = std::vector<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>
           ::begin(&g->productions);
  prod = (Production *)
         std::vector<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>::
         end(&g->productions);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Omega_h::Grammar::Production_*,_std::vector<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>_>
                                     *)&prod), bVar1) {
    pPVar2 = __gnu_cxx::
             __normal_iterator<Omega_h::Grammar::Production_*,_std::vector<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>_>
             ::operator*(&__end1);
    bVar1 = is_nonterminal(g,pPVar2->lhs);
    if (bVar1) {
      pPVar2->lhs = pPVar2->lhs + 1;
    }
    __end2 = std::vector<int,_std::allocator<int>_>::begin(&pPVar2->rhs);
    rhs_symb = (int *)std::vector<int,_std::allocator<int>_>::end(&pPVar2->rhs);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                       *)&rhs_symb), bVar1) {
      local_50 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&__end2);
      bVar1 = is_nonterminal(g,*local_50);
      if (bVar1) {
        *local_50 = *local_50 + 1;
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
    __gnu_cxx::
    __normal_iterator<Omega_h::Grammar::Production_*,_std::vector<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>_>
    ::operator++(&__end1);
  }
  local_68._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&g->symbol_names);
  local_60 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator+(&local_68,(long)g->nterminals);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_58,&local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"EOF",&local_89);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(&g->symbol_names,local_58,(value_type *)local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  g->nterminals = g->nterminals + 1;
  g->nsymbols = g->nsymbols + 1;
  return;
}

Assistant:

void add_end_terminal(Grammar& g) {
  for (auto& prod : g.productions) {
    if (is_nonterminal(g, prod.lhs)) prod.lhs++;
    for (auto& rhs_symb : prod.rhs) {
      if (is_nonterminal(g, rhs_symb)) rhs_symb++;
    }
  }
  g.symbol_names.insert(g.symbol_names.begin() + g.nterminals, "EOF");
  g.nterminals++;
  g.nsymbols++;
}